

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O0

MMDB_lookup_result_s *
lookup_sockaddr_ok(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ip,char *file,
                  char *mode_desc)

{
  MMDB_lookup_result_s local_90;
  int local_70;
  int local_6c;
  int mmdb_error;
  int gai_error;
  addrinfo *addresses;
  addrinfo hints;
  int ai_flags;
  char *mode_desc_local;
  char *file_local;
  char *ip_local;
  MMDB_s *mmdb_local;
  
  hints.ai_next._4_4_ = 4;
  memset(&addresses,0,0x30);
  hints.ai_flags = 1;
  _mmdb_error = (addrinfo *)0x0;
  if (*ip == ':') {
    addresses._0_4_ = hints.ai_next._4_4_ | 8;
    addresses._4_4_ = 10;
  }
  else {
    addresses._0_4_ = hints.ai_next._4_4_;
    addresses._4_4_ = 2;
  }
  local_6c = getaddrinfo(ip,(char *)0x0,(addrinfo *)&addresses,(addrinfo **)&mmdb_error);
  local_70 = 0;
  memset(__return_storage_ptr__,0,0x20);
  if (local_6c == 0) {
    MMDB_lookup_sockaddr(&local_90,mmdb,(sockaddr *)_mmdb_error->ai_addr,&local_70);
    __return_storage_ptr__->found_entry = local_90.found_entry;
    *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_90._1_7_;
    (__return_storage_ptr__->entry).mmdb = local_90.entry.mmdb;
    (__return_storage_ptr__->entry).offset = local_90.entry.offset;
    *(undefined4 *)&(__return_storage_ptr__->entry).field_0xc = local_90.entry._12_4_;
    __return_storage_ptr__->netmask = local_90.netmask;
    *(undefined6 *)&__return_storage_ptr__->field_0x1a = local_90._26_6_;
  }
  if (_mmdb_error != (addrinfo *)0x0) {
    freeaddrinfo(_mmdb_error);
  }
  test_lookup_errors(local_6c,local_70,"MMDB_lookup_sockaddr",ip,file,mode_desc);
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s lookup_sockaddr_ok(MMDB_s *mmdb,
                                        const char *ip,
                                        const char *file,
                                        const char *mode_desc) {
    int ai_flags = AI_NUMERICHOST;
    struct addrinfo hints = {.ai_socktype = SOCK_STREAM};
    struct addrinfo *addresses = NULL;

    if (ip[0] == ':') {
        hints.ai_flags = ai_flags;
#if defined AI_V4MAPPED && !defined __FreeBSD__
        hints.ai_flags |= AI_V4MAPPED;
#endif
        hints.ai_family = AF_INET6;
    } else {
        hints.ai_flags = ai_flags;
        hints.ai_family = AF_INET;
    }

    int gai_error = getaddrinfo(ip, NULL, &hints, &addresses);

    int mmdb_error = 0;
    MMDB_lookup_result_s result = {.found_entry = false};
    if (gai_error == 0) {
        result = MMDB_lookup_sockaddr(mmdb, addresses->ai_addr, &mmdb_error);
    }
    if (NULL != addresses) {
        freeaddrinfo(addresses);
    }

    test_lookup_errors(
        gai_error, mmdb_error, "MMDB_lookup_sockaddr", ip, file, mode_desc);

    return result;
}